

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,false,true>
               (uchar *ldata,uchar *rdata,uchar *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ValidityMask *pVVar6;
  ulong uVar7;
  byte bVar9;
  byte bVar10;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  idx_t idx_in_entry;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  uchar *puVar15;
  ulong uVar16;
  ulong uVar17;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  _Head_base<0UL,_unsigned_long_*,_false> local_90;
  uchar *local_88;
  ValidityMask *local_80;
  uchar *local_78;
  byte *local_70;
  idx_t local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  uchar *local_50;
  uchar *local_48;
  ulong local_40;
  ulong local_38;
  
  _Var11._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_88 = result_data;
  local_78 = ldata;
  local_70 = rdata;
  if (_Var11._M_head_impl == (unsigned_long *)0x0) {
    if (count != 0) {
      bVar9 = *rdata;
      _Var11._M_head_impl = (unsigned_long *)0x0;
      uVar12 = 0;
      do {
        bVar10 = ldata[uVar12];
        if (bVar9 == 0) {
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_90._M_head_impl =
                 (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,(unsigned_long *)&local_90);
            p_Var5 = p_Stack_a0;
            peVar4 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var11._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var11._M_head_impl;
            ldata = local_78;
          }
          bVar3 = (byte)uVar12 & 0x3f;
          _Var11._M_head_impl[uVar12 >> 6] =
               _Var11._M_head_impl[uVar12 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        else {
          bVar10 = bVar10 % bVar9;
        }
        local_88[uVar12] = bVar10;
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_58 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    local_38 = 0;
    local_80 = mask;
    local_68 = count;
    do {
      puVar14 = local_88;
      if (_Var11._M_head_impl == (unsigned_long *)0x0) {
        uVar17 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar17 = count;
        }
LAB_009d1765:
        uVar7 = uVar12;
        if (uVar12 < uVar17) {
          bVar9 = *local_70;
          do {
            bVar10 = ldata[uVar12];
            if (bVar9 == 0) {
              if (_Var11._M_head_impl == (unsigned_long *)0x0) {
                local_90._M_head_impl =
                     (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,(unsigned_long *)&local_90);
                p_Var5 = p_Stack_a0;
                peVar4 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar4;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var5;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_58);
                _Var11._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var11._M_head_impl;
                ldata = local_78;
              }
              bVar3 = (byte)uVar12 & 0x3f;
              _Var11._M_head_impl[uVar12 >> 6] =
                   _Var11._M_head_impl[uVar12 >> 6] &
                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
            }
            else {
              bVar10 = bVar10 % bVar9;
            }
            puVar14[uVar12] = bVar10;
            uVar12 = uVar12 + 1;
            uVar7 = uVar17;
            count = local_68;
          } while (uVar17 != uVar12);
        }
      }
      else {
        uVar1 = _Var11._M_head_impl[local_38];
        uVar17 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar17 = count;
        }
        uVar7 = uVar17;
        if (uVar1 != 0) {
          if (uVar1 == 0xffffffffffffffff) goto LAB_009d1765;
          uVar13 = uVar17 - uVar12;
          uVar7 = uVar12;
          if (uVar12 <= uVar17 && uVar13 != 0) {
            puVar14 = local_88 + uVar12;
            puVar15 = ldata + uVar12;
            uVar16 = 0;
            local_50 = puVar15;
            local_48 = puVar14;
            local_40 = uVar13;
            do {
              pVVar6 = local_80;
              if ((uVar1 >> (uVar16 & 0x3f) & 1) != 0) {
                bVar9 = puVar15[uVar16];
                if (*local_70 == 0) {
                  if (_Var11._M_head_impl == (unsigned_long *)0x0) {
                    local_90._M_head_impl =
                         (unsigned_long *)
                         (local_80->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_a8,(unsigned_long *)&local_90);
                    p_Var5 = p_Stack_a0;
                    peVar4 = local_a8;
                    local_a8 = (element_type *)0x0;
                    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar4;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var5;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_58);
                    _Var11._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (local_80->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var11._M_head_impl;
                    uVar13 = local_40;
                    ldata = local_78;
                    puVar14 = local_48;
                    puVar15 = local_50;
                    count = local_68;
                  }
                  bVar10 = (byte)(uVar16 + uVar12) & 0x3f;
                  _Var11._M_head_impl[uVar16 + uVar12 >> 6] =
                       _Var11._M_head_impl[uVar16 + uVar12 >> 6] &
                       (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
                }
                else {
                  bVar9 = bVar9 % *local_70;
                }
                puVar14[uVar16] = bVar9;
              }
              uVar16 = uVar16 + 1;
              mask = local_80;
              uVar7 = uVar17;
            } while (uVar13 != uVar16);
          }
        }
      }
      uVar12 = uVar7;
      local_38 = local_38 + 1;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}